

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxConversion.cpp
# Opt level: O3

bool Jinx::Impl::StringToNumber(String *value,double *outValue,NumericFormat format)

{
  byte bVar1;
  uint uVar2;
  pointer pcVar3;
  long lVar4;
  String s;
  istringstream istr;
  allocator<char> local_1e9;
  long *local_1e8;
  long local_1e0;
  long local_1d8 [2];
  locale local_1c8 [8];
  locale local_1c0 [8];
  long *local_1b8 [2];
  long local_1a8 [2];
  double local_198 [4];
  uint auStack_178 [22];
  ios_base local_120 [264];
  
  if (outValue == (double *)0x0) {
    __assert_fail("outValue",
                  "/workspace/llm4binary/github/license_c_cmakelists/JamesBoer[P]Jinx/Source/JxConversion.cpp"
                  ,0x56,"bool Jinx::Impl::StringToNumber(const String &, double *, NumericFormat)");
  }
  if (format == Continental) {
    pcVar3 = (value->_M_dataplus)._M_p;
    local_1e8 = local_1d8;
    std::__cxx11::basic_string<char,std::char_traits<char>,Jinx::Allocator<char>>::
    _M_construct<char*>((basic_string<char,std::char_traits<char>,Jinx::Allocator<char>> *)
                        &local_1e8,pcVar3,pcVar3 + value->_M_string_length);
    if (local_1e0 != 0) {
      lVar4 = 0;
      do {
        if (*(char *)((long)local_1e8 + lVar4) == ',') {
          *(undefined1 *)((long)local_1e8 + lVar4) = 0x2e;
        }
        lVar4 = lVar4 + 1;
      } while (local_1e0 != lVar4);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1b8,(char *)local_1e8,&local_1e9);
    std::__cxx11::istringstream::istringstream((istringstream *)local_198,(string *)local_1b8,_S_in)
    ;
    if (local_1b8[0] != local_1a8) {
      operator_delete(local_1b8[0],local_1a8[0] + 1);
    }
    std::locale::classic();
    std::ios::imbue(local_1c0);
    std::locale::~locale(local_1c0);
    std::istream::_M_extract<double>(local_198);
    uVar2 = *(uint *)((long)auStack_178 + *(long *)((long)local_198[0] + -0x18));
    std::__cxx11::istringstream::~istringstream((istringstream *)local_198);
    std::ios_base::~ios_base(local_120);
    if (local_1e8 != local_1d8) {
      MemFree(local_1e8,local_1d8[0] + 1);
    }
    if ((uVar2 & 5) != 0) {
      return false;
    }
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1e8,(value->_M_dataplus)._M_p,(allocator<char> *)local_1b8);
    std::__cxx11::istringstream::istringstream
              ((istringstream *)local_198,(string *)&local_1e8,_S_in);
    if (local_1e8 != local_1d8) {
      operator_delete(local_1e8,local_1d8[0] + 1);
    }
    std::locale::classic();
    std::ios::imbue(local_1c8);
    std::locale::~locale(local_1c8);
    std::istream::_M_extract<double>(local_198);
    bVar1 = *(byte *)((long)auStack_178 + *(long *)((long)local_198[0] + -0x18));
    std::__cxx11::istringstream::~istringstream((istringstream *)local_198);
    std::ios_base::~ios_base(local_120);
    if ((bVar1 & 5) != 0) {
      return false;
    }
  }
  return true;
}

Assistant:

inline_t bool StringToNumber(const String & value, double * outValue, NumericFormat format)
	{
		assert(outValue);
#ifdef JINX_USE_FROM_CHARS
		// In case contintental format is used, replace commas with decimal point
		if (format == NumericFormat::Continental)
		{
			String s = value;
			std::replace(s.begin(), s.end(), ',', '.');
			auto result = std::from_chars(s.data(), s.data() + s.size(), *outValue);
			if (result.ptr == s.data() + s.size())
				return true;
		}
		else
		{
			auto result = std::from_chars(value.data(), value.data() + value.size(), *outValue);
			if (result.ptr == value.data() + value.size())
				return true;
		}
		return false;
#else
		// In case contintental format is used, replace commas with decimal point
		if (format == NumericFormat::Continental)
		{
			String s = value;
			std::replace(s.begin(), s.end(), ',', '.');
			std::istringstream istr(s.c_str());
			istr.imbue(std::locale::classic());
			istr >> *outValue;
			if (istr.fail())
				return false;
		}
		else
		{
			std::istringstream istr(value.c_str());
			istr.imbue(std::locale::classic());
			istr >> *outValue;
			if (istr.fail())
				return false;
		}
		return true;
#endif
	}